

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

void __thiscall Pathie::Path::find(Path *this,_func_bool_Path_ptr *cb)

{
  bool bVar1;
  byte bVar2;
  Path *path_00;
  bool local_fa;
  Path local_e0;
  undefined1 local_c0 [8];
  Path path;
  Path local_98;
  Path local_78;
  entry_iterator local_48;
  undefined1 local_30 [8];
  entry_iterator iter;
  _func_bool_Path_ptr *cb_local;
  Path *this_local;
  
  iter.mp_cur_path = (Path *)cb;
  begin_entries((entry_iterator *)local_30,this);
  while( true ) {
    end_entries(&local_48,this);
    bVar1 = entry_iterator::operator!=((entry_iterator *)local_30,&local_48);
    entry_iterator::~entry_iterator(&local_48);
    if (!bVar1) break;
    path._31_1_ = 0;
    entry_iterator::operator->((entry_iterator *)local_30);
    str_abi_cxx11_(&local_78);
    bVar1 = std::operator!=(&local_78.m_path,".");
    local_fa = false;
    if (bVar1) {
      entry_iterator::operator->((entry_iterator *)local_30);
      str_abi_cxx11_(&local_98);
      path._31_1_ = 1;
      local_fa = std::operator!=(&local_98.m_path,"..");
    }
    if ((path._31_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_98);
    }
    std::__cxx11::string::~string((string *)&local_78);
    if (local_fa != false) {
      path_00 = entry_iterator::operator*((entry_iterator *)local_30);
      Path(&local_e0,path_00);
      join((Path *)local_c0,this,&local_e0);
      ~Path(&local_e0);
      bVar2 = (*(code *)iter.mp_cur_path)(local_c0);
      if (((bVar2 & 1) != 0) && (bVar1 = is_directory((Path *)local_c0), bVar1)) {
        find((Path *)local_c0,(_func_bool_Path_ptr *)iter.mp_cur_path);
      }
      ~Path((Path *)local_c0);
    }
    entry_iterator::operator++((entry_iterator *)local_30,0);
  }
  entry_iterator::~entry_iterator((entry_iterator *)local_30);
  return;
}

Assistant:

void Path::find(bool (*cb)(const Path& entry)) const
{
  for(entry_iterator iter=begin_entries(); iter != end_entries(); iter++) {
    // Skip . and ..
    if (iter->str() != "." && iter->str() != "..") {
      Path path = join(*iter);
      if (cb(path) && path.is_directory()) {
        path.find(cb);
      }
    }
  }
}